

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::DecodeDataBuilder::Push
          (DecodeDataBuilder *this)

{
  byte local_11;
  uint8 op;
  DecodeDataBuilder *this_local;
  
  local_11 = this->op_ | (byte)this->segment_len_;
  if ((this->need_underscore_ & 1U) != 0) {
    local_11 = local_11 | 0x80;
  }
  if (local_11 != 0) {
    std::__cxx11::string::operator+=((string *)&this->decode_data_,local_11);
  }
  Reset(this);
  return;
}

Assistant:

void Push() {
    uint8 op = (op_ | segment_len_);
    if (need_underscore_) op |= kAddUnderscore;
    if (op != 0) {
      decode_data_ += (char)op;
    }
    Reset();
  }